

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O0

void osThread::Initialize(void)

{
  int local_c;
  int i;
  
  snprintf(MainThread.Name,0x20,"main");
  pthread_key_create(&tlsKey,(__destr_function *)0x0);
  local_c = 0;
  while( true ) {
    if (0x2f < local_c) {
      IsInitialized = true;
      return;
    }
    if (Threads[local_c] == (osThread *)0x0) break;
    local_c = local_c + 1;
  }
  Threads[local_c] = &MainThread;
  IsInitialized = true;
  return;
}

Assistant:

void osThread::Initialize()
{
    // This is a hack to add the thread that called main() to the list
    snprintf(MainThread.Name, NAME_LENGTH_MAX, "main");
#ifdef _WIN32
    if ((dwTlsIndex = TlsAlloc()) == TLS_OUT_OF_INDEXES)
    {
        // ErrorExit( "TlsAlloc failed" );
    }
    TlsSetValue(dwTlsIndex, &MainThread);
#elif __linux__
    pthread_key_create(&tlsKey, nullptr);
#endif
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == nullptr)
        {
            Threads[i] = &MainThread;
            break;
        }
    }
    IsInitialized = true;
}